

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

vector<int,_std::allocator<int>_> *
ipx::Sortperm(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Int m,double *values,
             bool reverse)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  allocator_type local_31;
  double *values_local;
  
  values_local = values;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)m,&local_31);
  begin._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  uVar2 = 0;
  uVar3 = (ulong)(uint)m;
  if (m < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    begin._M_current[uVar2] = (int)uVar2;
  }
  if (values != (double *)0x0) {
    end._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (reverse) {
      if (begin._M_current != end._M_current) {
        iVar1 = pdqsort_detail::log2<long>((long)end._M_current - (long)begin._M_current >> 2);
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__0,false>
                  (begin,end,(anon_class_8_1_70098e60)&values_local,iVar1,true);
      }
    }
    else if (begin._M_current != end._M_current) {
      iVar1 = pdqsort_detail::log2<long>((long)end._M_current - (long)begin._M_current >> 2);
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__1,false>
                (begin,end,(anon_class_8_1_70098e60)&values_local,iVar1,true);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Int> Sortperm(Int m, const double* values, bool reverse) {
    std::vector<Int> perm(m);
    for (Int i = 0; i < m; i++) perm[i] = i;
    if (!values) return perm;

    if (reverse)
        pdqsort(perm.begin(), perm.end(), [&](Int i, Int j) {
            return std::make_pair(values[i], i) > std::make_pair(values[j], j);
        });
    else
        pdqsort(perm.begin(), perm.end(), [&](Int i, Int j) {
            return std::make_pair(values[i], i) < std::make_pair(values[j], j);
        });

    return perm;
}